

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O0

_Bool apply_linear_gradient(render_state_t *state,render_context_t *context,element_t *element)

{
  _Bool _Var1;
  float x1_00;
  float y1_00;
  float x2_00;
  float y2_00;
  float _y2;
  float _x2;
  float _y1;
  float _x1;
  length_t y2;
  length_t x2;
  length_t y1;
  length_t x1;
  gradient_stop_array_t stops;
  plutovg_matrix_t transform;
  plutovg_spread_method_t spread;
  units_type_t units;
  element_t *ref;
  element_t *peStack_70;
  int i;
  element_t *current;
  linear_gradient_attributes_t attributes;
  element_t *element_local;
  render_context_t *context_local;
  render_state_t *state_local;
  
  attributes.y2 = element;
  memset(&current,0,0x40);
  peStack_70 = attributes.y2;
  for (ref._4_4_ = 0; ref._4_4_ < 0x80; ref._4_4_ = ref._4_4_ + 1) {
    collect_gradient_attributes(peStack_70,(gradient_attributes_t *)&current);
    if (peStack_70->id == 8) {
      if ((attributes.base.stops == (element_t *)0x0) &&
         (_Var1 = has_attribute(peStack_70,0x2b), _Var1)) {
        attributes.base.stops = peStack_70;
      }
      if ((attributes.x1 == (element_t *)0x0) && (_Var1 = has_attribute(peStack_70,0x2e), _Var1)) {
        attributes.x1 = peStack_70;
      }
      if ((attributes.y1 == (element_t *)0x0) && (_Var1 = has_attribute(peStack_70,0x2c), _Var1)) {
        attributes.y1 = peStack_70;
      }
      if ((attributes.x2 == (element_t *)0x0) && (_Var1 = has_attribute(peStack_70,0x2f), _Var1)) {
        attributes.x2 = peStack_70;
      }
    }
    peStack_70 = resolve_href(context->document,peStack_70);
    if ((peStack_70 == (element_t *)0x0) || ((peStack_70->id != 8 && (peStack_70->id != 0xc))))
    break;
  }
  if (attributes.base.transform == (element_t *)0x0) {
    state_local._7_1_ = false;
  }
  else {
    fill_gradient_attributes(attributes.y2,(gradient_attributes_t *)&current);
    if (attributes.base.stops == (element_t *)0x0) {
      attributes.base.stops = attributes.y2;
    }
    if (attributes.x1 == (element_t *)0x0) {
      attributes.x1 = attributes.y2;
    }
    if (attributes.y1 == (element_t *)0x0) {
      attributes.y1 = attributes.y2;
    }
    if (attributes.x2 == (element_t *)0x0) {
      attributes.x2 = attributes.y2;
    }
    transform.f = 0.0;
    transform.e = 0.0;
    stops.size = 0x3f800000;
    transform.a = 0.0;
    transform.b = 1.0;
    transform.c = 0.0;
    transform.d = 0.0;
    memset(&x1,0,0x508);
    resolve_gradient_attributes
              (context,state,(gradient_attributes_t *)&current,(units_type_t *)&transform.f,
               (plutovg_spread_method_t *)&transform.e,(plutovg_matrix_t *)&stops.size,
               (gradient_stop_array_t *)&x1);
    y1.value = 0.0;
    y1.type = length_type_fixed;
    x2.value = 0.0;
    x2.type = length_type_fixed;
    y2.value = 100.0;
    y2.type = length_type_percent;
    _y1 = 0.0;
    _x1 = 1.4013e-45;
    parse_length(attributes.base.stops,0x2b,&y1,true,false);
    parse_length(attributes.x1,0x2e,&x2,true,false);
    parse_length(attributes.y1,0x2c,&y2,true,false);
    parse_length(attributes.x2,0x2f,(length_t *)&_y1,true,false);
    x1_00 = resolve_gradient_length(state,&y1,(units_type_t)transform.f,'x');
    y1_00 = resolve_gradient_length(state,&x2,(units_type_t)transform.f,'y');
    x2_00 = resolve_gradient_length(state,&y2,(units_type_t)transform.f,'x');
    y2_00 = resolve_gradient_length(state,(length_t *)&_y1,(units_type_t)transform.f,'y');
    plutovg_canvas_set_linear_gradient
              (context->canvas,x1_00,y1_00,x2_00,y2_00,(plutovg_spread_method_t)transform.e,
               (plutovg_gradient_stop_t *)&x1,(int)stops.data[0x3f].color.b,
               (plutovg_matrix_t *)&stops.size);
    state_local._7_1_ = true;
  }
  return state_local._7_1_;
}

Assistant:

static bool apply_linear_gradient(render_state_t* state, const render_context_t* context, const element_t* element)
{
    linear_gradient_attributes_t attributes = {0};
    const element_t* current = element;
    for(int i = 0; i < MAX_GRADIENT_DEPTH; ++i) {
        collect_gradient_attributes(current, &attributes.base);
        if(current->id == TAG_LINEAR_GRADIENT) {
            if(attributes.x1 == NULL && has_attribute(current, ATTR_X1))
                attributes.x1 = current;
            if(attributes.y1 == NULL && has_attribute(current, ATTR_Y1))
                attributes.y1 = current;
            if(attributes.x2 == NULL && has_attribute(current, ATTR_X2))
                attributes.x2 = current;
            if(attributes.y2 == NULL && has_attribute(current, ATTR_Y2)) {
                attributes.y2 = current;
            }
        }

        const element_t* ref = resolve_href(context->document, current);
        if(ref == NULL || !(ref->id == TAG_LINEAR_GRADIENT || ref->id == TAG_RADIAL_GRADIENT))
            break;
        current = ref;
    }

    if(attributes.base.stops == NULL)
        return false;
    fill_gradient_attributes(element, &attributes.base);
    if(attributes.x1 == NULL) attributes.x1 = element;
    if(attributes.y1 == NULL) attributes.y1 = element;
    if(attributes.x2 == NULL) attributes.x2 = element;
    if(attributes.y2 == NULL) attributes.y2 = element;

    units_type_t units = units_type_object_bounding_box;
    plutovg_spread_method_t spread = PLUTOVG_SPREAD_METHOD_PAD;
    plutovg_matrix_t transform = {1, 0, 0, 1, 0, 0};
    gradient_stop_array_t stops = {0};
    resolve_gradient_attributes(context, state, &attributes.base, &units, &spread, &transform, &stops);

    length_t x1 = {0, length_type_fixed};
    length_t y1 = {0, length_type_fixed};
    length_t x2 = {100, length_type_percent};
    length_t y2 = {0, length_type_fixed};

    parse_length(attributes.x1, ATTR_X1, &x1, true, false);
    parse_length(attributes.y1, ATTR_Y1, &y1, true, false);
    parse_length(attributes.x2, ATTR_X2, &x2, true, false);
    parse_length(attributes.y2, ATTR_Y2, &y2, true, false);

    float _x1 = resolve_gradient_length(state, &x1, units, 'x');
    float _y1 = resolve_gradient_length(state, &y1, units, 'y');
    float _x2 = resolve_gradient_length(state, &x2, units, 'x');
    float _y2 = resolve_gradient_length(state, &y2, units, 'y');

    plutovg_canvas_set_linear_gradient(context->canvas, _x1, _y1, _x2, _y2, spread, stops.data, stops.size, &transform);
    return true;
}